

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_cast.cpp
# Opt level: O0

unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>
duckdb::ExpressionExecutor::InitializeState(BoundCastExpression *expr,ExpressionExecutorState *root)

{
  bool bVar1;
  type child_expr;
  pointer in_RSI;
  unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_> in_RDI;
  CastLocalStateParameters parameters;
  ClientContext *context_ptr;
  templated_unique_single_t result;
  unique_ptr<duckdb::ExecuteFunctionState,_std::default_delete<duckdb::ExecuteFunctionState>_>
  *in_stack_ffffffffffffff48;
  pointer in_stack_ffffffffffffff50;
  ClientContext *local_a8;
  ExpressionExecutorState *in_stack_ffffffffffffff70;
  BoundCastExpression *in_stack_ffffffffffffff78;
  __uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_> this;
  ExpressionExecutor *this_00;
  undefined1 local_60 [8];
  optional_ptr<duckdb::BoundCastData,_true> local_58;
  optional_ptr<duckdb::ClientContext,_true> local_50;
  CastLocalStateParameters local_48;
  ClientContext *local_38;
  pointer local_10;
  
  this_00 = (ExpressionExecutor *)&stack0xffffffffffffffe0;
  this._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>.
  super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl =
       (tuple<duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>)
       (tuple<duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
       .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl;
  local_10 = in_RSI;
  make_uniq<duckdb::ExecuteFunctionState,duckdb::BoundCastExpression_const&,duckdb::ExpressionExecutorState&>
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  unique_ptr<duckdb::ExecuteFunctionState,_std::default_delete<duckdb::ExecuteFunctionState>,_true>
  ::operator->((unique_ptr<duckdb::ExecuteFunctionState,_std::default_delete<duckdb::ExecuteFunctionState>,_true>
                *)in_stack_ffffffffffffff50);
  child_expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)in_stack_ffffffffffffff50);
  ExpressionState::AddChild
            ((ExpressionState *)
             this._M_t.
             super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
             .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,child_expr);
  unique_ptr<duckdb::ExecuteFunctionState,_std::default_delete<duckdb::ExecuteFunctionState>,_true>
  ::operator->((unique_ptr<duckdb::ExecuteFunctionState,_std::default_delete<duckdb::ExecuteFunctionState>,_true>
                *)in_stack_ffffffffffffff50);
  ExpressionState::Finalize(&in_stack_ffffffffffffff50->super_ExpressionState);
  if (local_10[0xe] != (Expression *)0x0) {
    bVar1 = HasContext((ExpressionExecutor *)0x62dd1c);
    if (bVar1) {
      local_a8 = GetContext(this_00);
    }
    else {
      local_a8 = (ClientContext *)0x0;
    }
    local_38 = local_a8;
    optional_ptr<duckdb::ClientContext,_true>::optional_ptr(&local_50,local_a8);
    optional_ptr<duckdb::BoundCastData,_true>::optional_ptr
              ((optional_ptr<duckdb::BoundCastData,_true> *)in_stack_ffffffffffffff50,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)in_stack_ffffffffffffff48);
    CastLocalStateParameters::CastLocalStateParameters(&local_48,local_50,local_58);
    (*(code *)local_10[0xe])(local_60,&local_48);
    in_stack_ffffffffffffff50 =
         unique_ptr<duckdb::ExecuteFunctionState,_std::default_delete<duckdb::ExecuteFunctionState>,_true>
         ::operator->((unique_ptr<duckdb::ExecuteFunctionState,_std::default_delete<duckdb::ExecuteFunctionState>,_true>
                       *)in_stack_ffffffffffffff50);
    unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>::
    operator=((unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>
               *)in_stack_ffffffffffffff50,
              (unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>
               *)in_stack_ffffffffffffff48);
    unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>::
    ~unique_ptr((unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>
                 *)0x62ddf6);
  }
  unique_ptr<duckdb::ExpressionState,std::default_delete<duckdb::ExpressionState>,true>::
  unique_ptr<duckdb::ExecuteFunctionState,std::default_delete<std::unique_ptr<duckdb::ExpressionState,std::default_delete<duckdb::ExpressionState>>>,void>
            ((unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>
              *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  unique_ptr<duckdb::ExecuteFunctionState,_std::default_delete<duckdb::ExecuteFunctionState>,_true>
  ::~unique_ptr((unique_ptr<duckdb::ExecuteFunctionState,_std::default_delete<duckdb::ExecuteFunctionState>,_true>
                 *)0x62de4d);
  return (unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>)
         (__uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
         .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ExpressionState> ExpressionExecutor::InitializeState(const BoundCastExpression &expr,
                                                                ExpressionExecutorState &root) {
	auto result = make_uniq<ExecuteFunctionState>(expr, root);
	result->AddChild(*expr.child);
	result->Finalize();

	if (expr.bound_cast.init_local_state) {
		auto context_ptr = root.executor->HasContext() ? &root.executor->GetContext() : nullptr;
		CastLocalStateParameters parameters(context_ptr, expr.bound_cast.cast_data);
		result->local_state = expr.bound_cast.init_local_state(parameters);
	}
	return std::move(result);
}